

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int IoTHubTransport_MQTT_Common_SetRetryPolicy
              (TRANSPORT_LL_HANDLE handle,IOTHUB_CLIENT_RETRY_POLICY retryPolicy,
              size_t retryTimeoutLimitInSeconds)

{
  RETRY_CONTROL_HANDLE retry_control_handle;
  LOGGER_LOG p_Var1;
  RETRY_CONTROL_HANDLE pRVar2;
  RETRY_CONTROL_HANDLE previous_retry_control_handle;
  PMQTTTRANSPORT_HANDLE_DATA transport_data;
  LOGGER_LOG l_1;
  RETRY_CONTROL_HANDLE new_retry_control_handle;
  LOGGER_LOG l;
  int result;
  size_t retryTimeoutLimitInSeconds_local;
  IOTHUB_CLIENT_RETRY_POLICY retryPolicy_local;
  TRANSPORT_LL_HANDLE handle_local;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_SetRetryPolicy",0xe5f,1,
                "Invalid handle parameter. NULL.");
    }
    l._4_4_ = 0xe60;
  }
  else {
    pRVar2 = retry_control_create(retryPolicy,(uint)retryTimeoutLimitInSeconds);
    if (pRVar2 == (RETRY_CONTROL_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"IoTHubTransport_MQTT_Common_SetRetryPolicy",0xe68,1,
                  "Failed creating new retry control handle");
      }
      l._4_4_ = 0xe69;
    }
    else {
      retry_control_handle = *(RETRY_CONTROL_HANDLE *)((long)handle + 0x110);
      *(RETRY_CONTROL_HANDLE *)((long)handle + 0x110) = pRVar2;
      retry_control_destroy(retry_control_handle);
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

int IoTHubTransport_MQTT_Common_SetRetryPolicy(TRANSPORT_LL_HANDLE handle, IOTHUB_CLIENT_RETRY_POLICY retryPolicy, size_t retryTimeoutLimitInSeconds)
{
    int result;

    if (handle == NULL)
    {
        LogError("Invalid handle parameter. NULL.");
        result = MU_FAILURE;
    }
    else
    {
        RETRY_CONTROL_HANDLE new_retry_control_handle;

        if ((new_retry_control_handle = retry_control_create(retryPolicy, (unsigned int)retryTimeoutLimitInSeconds)) == NULL)
        {
            LogError("Failed creating new retry control handle");
            result = MU_FAILURE;
        }
        else
        {
            PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
            RETRY_CONTROL_HANDLE previous_retry_control_handle = transport_data->retry_control_handle;

            transport_data->retry_control_handle = new_retry_control_handle;
            retry_control_destroy(previous_retry_control_handle);

            result = 0;
        }
    }

    return result;
}